

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

void __thiscall
GlobOpt::ArrayLowerBoundCheckHoistInfo::SetLoop
          (ArrayLowerBoundCheckHoistInfo *this,Loop *loop,int indexConstantValue,
          bool isLoopCountBasedBound)

{
  code *pcVar1;
  bool bVar2;
  IntConstantBounds in_RAX;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  IntConstantBounds local_38;
  
  local_38 = in_RAX;
  pBVar3 = CompatibleBoundCheckBlock(this);
  if (pBVar3 != (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x42,"(!CompatibleBoundCheckBlock())","!CompatibleBoundCheckBlock()");
    if (!bVar2) goto LAB_004a7c5c;
    *puVar4 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x43,"(loop)","loop");
    if (!bVar2) {
LAB_004a7c5c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->loop = loop;
  this->indexSym = (StackSym *)0x0;
  this->offset = 0;
  this->indexValue = (Value *)0x0;
  IntConstantBounds::IntConstantBounds(&local_38,indexConstantValue,indexConstantValue);
  this->indexConstantBounds = local_38;
  this->isLoopCountBasedBound = isLoopCountBasedBound;
  this->loopCount = (LoopCount *)0x0;
  return;
}

Assistant:

void GlobOpt::ArrayLowerBoundCheckHoistInfo::SetLoop(
    ::Loop *const loop,
    const int indexConstantValue,
    const bool isLoopCountBasedBound)
{
    Assert(!CompatibleBoundCheckBlock());
    Assert(loop);

    this->loop = loop;
    indexSym = nullptr;
    offset = 0;
    indexValue = nullptr;
    indexConstantBounds = IntConstantBounds(indexConstantValue, indexConstantValue);
    this->isLoopCountBasedBound = isLoopCountBasedBound;
    loopCount = nullptr;
}